

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRepr.c
# Opt level: O0

int Aig_ObjCheckTfi_rec(Aig_Man_t *p,Aig_Obj_t *pNode,Aig_Obj_t *pOld)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pOld_local;
  Aig_Obj_t *pNode_local;
  Aig_Man_t *p_local;
  
  if (pNode == (Aig_Obj_t *)0x0) {
    p_local._4_4_ = 0;
  }
  else {
    iVar1 = Aig_ObjIsCi(pNode);
    if (iVar1 == 0) {
      if (pNode == pOld) {
        p_local._4_4_ = 1;
      }
      else {
        iVar1 = Aig_ObjIsTravIdCurrent(p,pNode);
        if (iVar1 == 0) {
          Aig_ObjSetTravIdCurrent(p,pNode);
          pAVar2 = Aig_ObjFanin0(pNode);
          iVar1 = Aig_ObjCheckTfi_rec(p,pAVar2,pOld);
          if (iVar1 == 0) {
            pAVar2 = Aig_ObjFanin1(pNode);
            iVar1 = Aig_ObjCheckTfi_rec(p,pAVar2,pOld);
            if (iVar1 == 0) {
              pAVar2 = Aig_ObjEquiv(p,pNode);
              p_local._4_4_ = Aig_ObjCheckTfi_rec(p,pAVar2,pOld);
            }
            else {
              p_local._4_4_ = 1;
            }
          }
          else {
            p_local._4_4_ = 1;
          }
        }
        else {
          p_local._4_4_ = 0;
        }
      }
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

int Aig_ObjCheckTfi_rec( Aig_Man_t * p, Aig_Obj_t * pNode, Aig_Obj_t * pOld )
{
    // check the trivial cases
    if ( pNode == NULL )
        return 0;
    if ( Aig_ObjIsCi(pNode) )
        return 0;
//    if ( pNode->Id < pOld->Id ) // cannot use because of choices of pNode
//        return 0;
    if ( pNode == pOld )
        return 1;
    // skip the visited node
    if ( Aig_ObjIsTravIdCurrent( p, pNode ) )
        return 0;
    Aig_ObjSetTravIdCurrent( p, pNode );
    // check the children
    if ( Aig_ObjCheckTfi_rec( p, Aig_ObjFanin0(pNode), pOld ) )
        return 1;
    if ( Aig_ObjCheckTfi_rec( p, Aig_ObjFanin1(pNode), pOld ) )
        return 1;
    // check equivalent nodes
    return Aig_ObjCheckTfi_rec( p, Aig_ObjEquiv(p, pNode), pOld );
}